

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O0

void __thiscall MainWindow::updateFloatingDisplayVisibility(MainWindow *this)

{
  FloatingDisplayVisibility FVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  bool local_21;
  byte local_16;
  bool visible;
  FloatingDisplayVisibility visibility;
  MainWindow *this_local;
  
  FVar1 = getFloatingDisplayVisibility();
  local_16 = 1;
  uVar2 = extraout_RDX;
  if (FVar1 != FloatingDisplayVisibility_ALWAYS_SHOWN) {
    local_21 = true;
    if (FVar1 != FloatingDisplayVisibility_ALWAYS_HIDDEN) {
      local_21 = QWidget::isVisible((QWidget *)this);
      uVar2 = extraout_RDX_00;
    }
    local_16 = local_21 ^ 0xff;
  }
  local_16 = local_16 & 1;
  if (this->floatingDisplay == (FloatingDisplay *)0x0) {
    if (local_16 != 0) {
      showFloatingDisplay(this);
    }
  }
  else {
    (**(code **)(*(long *)this->floatingDisplay + 0x68))
              (this->floatingDisplay,local_16,uVar2,local_16);
  }
  return;
}

Assistant:

void MainWindow::updateFloatingDisplayVisibility() {
	FloatingDisplayVisibility visibility = getFloatingDisplayVisibility();
	bool visible = visibility == FloatingDisplayVisibility_ALWAYS_SHOWN
		|| !(visibility == FloatingDisplayVisibility_ALWAYS_HIDDEN || isVisible());
	if (floatingDisplay == NULL) {
		if (visible) showFloatingDisplay();
	} else {
		floatingDisplay->setVisible(visible);
	}
}